

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_set_lsn_filename(char *fn)

{
  if (data_dir[0] != (char *)0x0) {
    __assert_fail("data_dir[DATA_TYPE_SENT] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x3aa,"int corpus_set_lsn_filename(const char *)");
  }
  requires_sent = 1;
  transcription_filename = fn;
  transcription_fp = (FILE *)fopen(fn,"r");
  if ((FILE *)transcription_fp != (FILE *)0x0) {
    return 0;
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                 ,0x3b2,"Can not open transcription file \'%s\'",transcription_filename);
  exit(1);
}

Assistant:

int
corpus_set_lsn_filename(const char *fn)
{
    assert(data_dir[DATA_TYPE_SENT] == NULL);

    transcription_filename = fn;

    requires_sent = TRUE;

    transcription_fp = fopen(transcription_filename, "r");
    if (transcription_fp == NULL) {
	E_FATAL_SYSTEM("Can not open transcription file '%s'", transcription_filename);
    }

    return S3_SUCCESS;
}